

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManEvaluateMappingEdge(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  int iVar2;
  Vec_Wec_t *pVVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p->vPath->nSize = 0;
  Sbl_ManGetCurrentMapping(p);
  iVar6 = 1;
  iVar1 = Gia_ManEvalWindow(p->pGia,p->vLeaves,p->vAnds,p->vWindow,p->vPolar,1);
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeTime = p->timeTime + lVar5 + lVar4;
  if (DelayGlo < iVar1) {
    pVVar3 = p->vWindow;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        if (0 < (&pVVar3->pArray->nSize)[lVar4 * 2]) {
          Vec_IntPush(p->vPath,(int)lVar4 + 1);
          pVVar3 = p->vWindow;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 2;
      } while (lVar5 < pVVar3->nSize);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Sbl_ManEvaluateMappingEdge( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vArray; 
    int i, DelayMax;
    Vec_IntClear( p->vPath );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    // derive new timing
    DelayMax = Gia_ManEvalWindow( p->pGia, p->vLeaves, p->vAnds, p->vWindow, p->vPolar, 1 );
    p->timeTime += Abc_Clock() - clk;
    if ( DelayMax <= DelayGlo )
        return 1;
    // create critical path composed of all nodes
    Vec_WecForEachLevel( p->vWindow, vArray, i )
        if ( Vec_IntSize(vArray) > 0 )
            Vec_IntPush( p->vPath, Abc_Var2Lit(i, 1) );
    return 0;
}